

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O1

void __thiscall
muduo::Logger::Impl::Impl(Impl *this,LogLevel level,int savedErrno,SourceFile *file,int line)

{
  undefined4 *puVar1;
  int iVar2;
  undefined4 uVar3;
  Timestamp TVar4;
  char *pcVar5;
  self *this_00;
  LogStream *pLVar6;
  char **ppcVar7;
  ulong __n;
  long *in_FS_OFFSET;
  
  TVar4 = Timestamp::now();
  (this->time_).microSecondsSinceEpoch_ = TVar4.microSecondsSinceEpoch_;
  memset(&this->stream_,0,0xfb8);
  (this->stream_).buffer_.cur_ = (this->stream_).buffer_.data_;
  (this->stream_).buffer_.cookie_ = detail::FixedBuffer<4000>::cookieStart;
  this->level_ = level;
  this->line_ = line;
  iVar2 = file->size_;
  uVar3 = *(undefined4 *)&file->field_0xc;
  (this->basename_).data_ = file->data_;
  (this->basename_).size_ = iVar2;
  *(undefined4 *)&(this->basename_).field_0xc = uVar3;
  formatTime(this);
  if ((int)*in_FS_OFFSET == 0) {
    CurrentThread::cacheTid();
  }
  ppcVar7 = &(this->stream_).buffer_.cur_;
  __n = (ulong)(int)*in_FS_OFFSET;
  if (__n < (ulong)(long)((int)ppcVar7 - (int)*ppcVar7)) {
    memcpy(*ppcVar7,(void *)*in_FS_OFFSET,__n);
    *ppcVar7 = *ppcVar7 + __n;
  }
  pcVar5 = *ppcVar7;
  if (6 < (uint)((int)ppcVar7 - (int)pcVar5)) {
    puVar1 = *(undefined4 **)(LogLevelName + (ulong)level * 8);
    *(undefined2 *)(pcVar5 + 4) = *(undefined2 *)(puVar1 + 1);
    *(undefined4 *)pcVar5 = *puVar1;
    *ppcVar7 = *ppcVar7 + 6;
  }
  if (savedErrno != 0) {
    pcVar5 = strerror_r(savedErrno,(char *)(*in_FS_OFFSET + -0x290),0x200);
    this_00 = LogStream::operator<<(&this->stream_,pcVar5);
    ppcVar7 = &(this_00->buffer_).cur_;
    pcVar5 = (this_00->buffer_).cur_;
    if (8 < (uint)((int)ppcVar7 - (int)pcVar5)) {
      builtin_strncpy(pcVar5," (errno=",8);
      *ppcVar7 = *ppcVar7 + 8;
    }
    pLVar6 = LogStream::operator<<(this_00,savedErrno);
    ppcVar7 = &(pLVar6->buffer_).cur_;
    pcVar5 = (pLVar6->buffer_).cur_;
    if (2 < (uint)((int)ppcVar7 - (int)pcVar5)) {
      pcVar5[0] = ')';
      pcVar5[1] = ' ';
      *ppcVar7 = *ppcVar7 + 2;
    }
  }
  return;
}

Assistant:

Logger::Impl::Impl(LogLevel level, int savedErrno, const SourceFile& file, int line)
  : time_(Timestamp::now()),
    stream_(),
    level_(level),
    line_(line),
    basename_(file)
{
  formatTime();
  CurrentThread::tid();
  stream_ << T(CurrentThread::tidString(), CurrentThread::tidStringLength());
  stream_ << T(LogLevelName[level], 6);
  if (savedErrno != 0)
  {
    stream_ << strerror_tl(savedErrno) << " (errno=" << savedErrno << ") ";
  }
}